

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O0

_Bool COSE_Sign_SetContent(HCOSE_SIGN h,byte *rgb,size_t cb,cose_errback *perr)

{
  _Bool _Var1;
  _Bool local_39;
  _Bool f;
  COSE_SignMessage *pMessage;
  cn_cbor *p;
  cose_errback *perr_local;
  size_t cb_local;
  byte *rgb_local;
  HCOSE_SIGN h_local;
  
  pMessage = (COSE_SignMessage *)0x0;
  local_39 = false;
  _Var1 = IsValidSignHandle(h);
  if (_Var1) {
    if (rgb == (byte *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      pMessage = (COSE_SignMessage *)cn_cbor_data_create(rgb,(int)cb,(cn_cbor_errback *)0x0);
      if (pMessage == (COSE_SignMessage *)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
      }
      else {
        _Var1 = _COSE_array_replace((COSE *)h,(cn_cbor *)pMessage,2,(cn_cbor_errback *)0x0);
        if (_Var1) {
          pMessage = (COSE_SignMessage *)0x0;
          local_39 = true;
        }
        else if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
      }
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
  if (pMessage != (COSE_SignMessage *)0x0) {
    cn_cbor_free((cn_cbor *)pMessage);
  }
  return local_39;
}

Assistant:

bool COSE_Sign_SetContent(HCOSE_SIGN h, const byte * rgb, size_t cb, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif
	cn_cbor * p = NULL;
	COSE_SignMessage * pMessage = (COSE_SignMessage *)h;
	bool f = false;

	CHECK_CONDITION(IsValidSignHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgb != NULL, COSE_ERR_INVALID_PARAMETER);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	p = cn_cbor_data_create(rgb, (int) cb, CBOR_CONTEXT_PARAM_COMMA NULL);
	CHECK_CONDITION(p != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(_COSE_array_replace(&pMessage->m_message, p, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_OUT_OF_MEMORY);
	p = NULL;

	f = true;
errorReturn:
	if (p != NULL) CN_CBOR_FREE(p, context);

	return f;
}